

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

ON__UINT32 __thiscall ON_Buffer::CRC32(ON_Buffer *this,ON__UINT32 current_remainder)

{
  ON_BUFFER_SEGMENT *pOVar1;
  ON_BUFFER_SEGMENT *local_40;
  ON_BUFFER_SEGMENT *seg0;
  ON_BUFFER_SEGMENT *seg;
  ON_BUFFER_SEGMENT *prev_seg;
  ON__UINT64 seg_size;
  ON__UINT64 size;
  ON__UINT32 current_remainder_local;
  ON_Buffer *this_local;
  
  local_40 = (ON_BUFFER_SEGMENT *)0x0;
  seg_size = 0;
  seg0 = this->m_first_segment;
  size._4_4_ = current_remainder;
  do {
    pOVar1 = local_40;
    if (seg0 == (ON_BUFFER_SEGMENT *)0x0) {
      return size._4_4_;
    }
    local_40 = seg0;
    if (seg0->m_segment_position1 < seg0->m_segment_position0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                 ,0x366,"","corrupt buffer - segment\'s position values are invalid.");
    }
    else {
      if (pOVar1 == (ON_BUFFER_SEGMENT *)0x0) {
        if (seg0->m_segment_position0 != 0) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x373,"","corrupt buffer - first segment has non-zero value for position0.");
        }
      }
      else if (pOVar1->m_segment_position1 != seg0->m_segment_position0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                   ,0x37e,"",
                   "corrupt buffer - previous segment\'s position1 !- segment\'s position0.");
      }
      prev_seg = (ON_BUFFER_SEGMENT *)(seg0->m_segment_position1 - seg0->m_segment_position0);
      if (prev_seg == (ON_BUFFER_SEGMENT *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                   ,0x387,"","corrupt buffer - empty segment buffer.");
      }
      else {
        if (this->m_buffer_size < (long)&prev_seg->m_prev_segment + seg_size) {
          if ((seg0 != this->m_last_segment) || (seg0->m_next_segment != (ON_BUFFER_SEGMENT *)0x0))
          {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                       ,0x391,"","corrupt buffer - segments contain more bytes than m_buffer_size.")
            ;
          }
          prev_seg = (ON_BUFFER_SEGMENT *)(this->m_buffer_size - seg_size);
        }
        size._4_4_ = ON_CRC32(size._4_4_,(size_t)prev_seg,seg0->m_segment_buffer);
        seg_size = (long)&prev_seg->m_prev_segment + seg_size;
        if (this->m_buffer_size <= seg_size) {
          if (((seg0 == this->m_last_segment) && (seg0->m_next_segment == (ON_BUFFER_SEGMENT *)0x0))
             && (seg_size <= this->m_buffer_size)) {
            return size._4_4_;
          }
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_embedded_file.cpp"
                     ,0x39e,"","corrupt buffer - list of segments is too long.");
          return size._4_4_;
        }
      }
    }
    seg0 = seg0->m_next_segment;
  } while( true );
}

Assistant:

ON__UINT32 ON_Buffer::CRC32( ON__UINT32 current_remainder ) const
{
  ON__UINT64 size, seg_size;
  const struct ON_BUFFER_SEGMENT* prev_seg;
  const struct ON_BUFFER_SEGMENT* seg;
  const struct ON_BUFFER_SEGMENT* seg0 = 0;

  size = 0;
  for ( seg = m_first_segment; 0 != seg; seg = seg->m_next_segment )
  {
    // prev_seg is set this way so that the error handling
    // code can use continue statements for non-fatal errors.
    prev_seg = seg0;
    seg0 = seg;

    if ( seg->m_segment_position0 > seg->m_segment_position1 )
    {
      // This is really bad!  If you can determine how the corruption occurs,
      // please make a bug report and tell Dale Lear as soon as possible.
      ON_ERROR("corrupt buffer - segment's position values are invalid.");
      continue;
    }

    if ( 0 == prev_seg )
    {
      if ( 0 != seg->m_segment_position0 )
      {
        // The first segment should have seg->m_segment_position0 = 0.
        // We'll keep going after the call to ON_ERROR.
        //
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - first segment has non-zero value for position0.");
      }
    }
    else if ( prev_seg->m_segment_position1 != seg->m_segment_position0 )
    {
      // Every segment after the first should have 
      // seg->m_segment_position0 = previous_segment->m_segment_position1.
      // We'll keep going after the call to ON_ERROR.
      //
      // If you can determine how the corruption occurred, please
      // make a bug report and assign it to Dale Lear.
      ON_ERROR("corrupt buffer - previous segment's position1 !- segment's position0.");
    }

    seg_size = seg->m_segment_position1 - seg->m_segment_position0;

    if ( 0 == seg_size )
    {
      // If you can determine how the corruption occurred, please
      // make a bug report and assign it to Dale Lear.
      ON_ERROR("corrupt buffer - empty segment buffer.");
      continue;
    }
    
    if ( seg_size + size > m_buffer_size )
    {
      if ( seg != m_last_segment || seg->m_next_segment )
      {
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - segments contain more bytes than m_buffer_size.");
      }
      seg_size = m_buffer_size - size;
    }

    current_remainder = ON_CRC32(current_remainder,(size_t)seg_size,seg->m_segment_buffer);
    size += seg_size;
    if ( size >= m_buffer_size )
    {
      if ( seg != m_last_segment || 0 != seg->m_next_segment || size > m_buffer_size )
      {
        // If you can determine how the corruption occurred, please
        // make a bug report and assign it to Dale Lear.
        ON_ERROR("corrupt buffer - list of segments is too long.");
      }
      break;
    }
  }

  return current_remainder;
}